

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::AddNodePrefixes(aiNode *node,char *prefix,uint len)

{
  uint local_20;
  uint i;
  uint len_local;
  char *prefix_local;
  aiNode *node_local;
  
  PrefixString(&node->mName,prefix,len);
  for (local_20 = 0; local_20 < node->mNumChildren; local_20 = local_20 + 1) {
    AddNodePrefixes(node->mChildren[local_20],prefix,len);
  }
  return;
}

Assistant:

void SceneCombiner::AddNodePrefixes(aiNode* node, const char* prefix, unsigned int len) {
    ai_assert(NULL != prefix);
    PrefixString(node->mName,prefix,len);

    // Process all children recursively
    for ( unsigned int i = 0; i < node->mNumChildren; ++i ) {
        AddNodePrefixes( node->mChildren[ i ], prefix, len );
    }
}